

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O3

void __thiscall
t_javame_generator::generate_java_struct_equality
          (t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  e_req eVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar8;
  undefined8 *puVar9;
  ostream *poVar10;
  size_type *psVar11;
  pointer pptVar12;
  _Alloc_hider _Var13;
  string name;
  string unequal;
  string that_present;
  string this_present;
  string local_150;
  string local_130;
  string local_110;
  ostream *local_f0;
  string local_e8;
  string local_c8;
  t_struct *local_a8;
  string local_a0;
  string local_80;
  pointer local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  t_type *local_38;
  
  local_a8 = tstruct;
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  local_f0 = out;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_110._M_dataplus._M_p,local_110._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"public boolean equals(Object that) {",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_f0,local_110._M_dataplus._M_p,local_110._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (that == null)",0x11);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return false;",0xf);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (that instanceof ",0x14);
  iVar6 = (*(local_a8->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,*(char **)CONCAT44(extraout_var,iVar6),
                      ((undefined8 *)CONCAT44(extraout_var,iVar6))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_c8,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return this.equals((",0x16);
  iVar6 = (*(local_a8->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,*(char **)CONCAT44(extraout_var_00,iVar6),
                      ((undefined8 *)CONCAT44(extraout_var_00,iVar6))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,")that);",7);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_150._M_dataplus._M_p,local_150._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return false;",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  poVar7 = local_f0;
  t_oop_generator::scope_down(&this->super_t_oop_generator,local_f0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_110._M_dataplus._M_p,local_110._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"public boolean equals(",0x16);
  iVar6 = (*(local_a8->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,*(char **)CONCAT44(extraout_var_01,iVar6),
                      ((undefined8 *)CONCAT44(extraout_var_01,iVar6))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," that) {",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_f0,local_110._M_dataplus._M_p,local_110._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (that == null)",0x11);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return false;",0xf);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (this == that)",0x11);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_c8,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return true;",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  pptVar12 = (local_a8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar12 !=
      (local_a8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_f0,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      local_38 = t_type::get_true_type((*pptVar12)->type_);
      eVar3 = (*pptVar12)->req_;
      bVar5 = type_can_be_null(this,local_38);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      pcVar4 = ((*pptVar12)->name_)._M_dataplus._M_p;
      local_60 = pptVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar4,pcVar4 + ((*pptVar12)->name_)._M_string_length);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"true","");
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"true","");
      pptVar12 = local_60;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      if (eVar3 == T_OPTIONAL || bVar5) {
        generate_isset_check_abi_cxx11_(&local_130,this,*local_60);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x399a99);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_150.field_2._M_allocated_capacity = *psVar11;
          local_150.field_2._8_8_ = plVar8[3];
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar11;
          local_150._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_150._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_150._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        generate_isset_check_abi_cxx11_(&local_130,this,*pptVar12);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x393778);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_150.field_2._M_allocated_capacity = *psVar11;
          local_150.field_2._8_8_ = plVar8[3];
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar11;
          local_150._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_150._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_150._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
      }
      t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_f0,local_150._M_dataplus._M_p,local_150._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"boolean this_present_",0x15);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_110._M_dataplus._M_p,local_110._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_80._M_dataplus._M_p,local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"boolean that_present_",0x15);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_110._M_dataplus._M_p,local_110._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_a0._M_dataplus._M_p,local_a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_e8,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_e8._M_dataplus._M_p,local_e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"this_present_",0xd);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_110._M_dataplus._M_p,local_110._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," || that_present_",0x11);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_110._M_dataplus._M_p,local_110._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") {",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_f0,local_150._M_dataplus._M_p,local_150._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (!(",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"this_present_",0xd);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_110._M_dataplus._M_p,local_110._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," && that_present_",0x11);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_110._M_dataplus._M_p,local_110._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"))",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return false;",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      iVar6 = (*(local_38->super_t_doc)._vptr_t_doc[7])();
      paVar2 = &local_e8.field_2;
      if ((char)iVar6 == '\0') {
        if (bVar5) {
          std::operator+(&local_58,"!this.",&local_110);
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_58);
          psVar11 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_e8.field_2._M_allocated_capacity = *psVar11;
            local_e8.field_2._8_8_ = puVar9[3];
            local_e8._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar11;
            local_e8._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_e8._M_string_length = puVar9[1];
          *puVar9 = psVar11;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e8,(ulong)local_110._M_dataplus._M_p);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          psVar11 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_130.field_2._M_allocated_capacity = *psVar11;
            local_130.field_2._8_8_ = puVar9[3];
          }
          else {
            local_130.field_2._M_allocated_capacity = *psVar11;
            local_130._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_130._M_string_length = puVar9[1];
          *puVar9 = psVar11;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
          goto LAB_0027e18b;
        }
        std::operator+(&local_e8,"this.",&local_110);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_130.field_2._M_allocated_capacity = *psVar11;
          local_130.field_2._8_8_ = plVar8[3];
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar11;
          local_130._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_130._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_130,(ulong)local_110._M_dataplus._M_p);
        psVar11 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_150.field_2._M_allocated_capacity = *psVar11;
          local_150.field_2._8_8_ = puVar9[3];
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar11;
          local_150._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_150._M_string_length = puVar9[1];
        *puVar9 = psVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        _Var13._M_p = local_e8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar2) goto LAB_0027e22a;
      }
      else {
        std::operator+(&local_58,"TBaseHelper.compareTo(this.",&local_110);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_58);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_e8.field_2._M_allocated_capacity = *psVar11;
          local_e8.field_2._8_8_ = plVar8[3];
          local_e8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar11;
          local_e8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_e8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_e8,(ulong)local_110._M_dataplus._M_p);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        psVar11 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_130.field_2._M_allocated_capacity = *psVar11;
          local_130.field_2._8_8_ = puVar9[3];
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar11;
          local_130._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_130._M_string_length = puVar9[1];
        *puVar9 = psVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
LAB_0027e18b:
        psVar11 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_150.field_2._M_allocated_capacity = *psVar11;
          local_150.field_2._8_8_ = puVar9[3];
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar11;
          local_150._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_150._M_string_length = puVar9[1];
        *puVar9 = psVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        _Var13._M_p = local_58._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
LAB_0027e22a:
          operator_delete(_Var13._M_p);
        }
      }
      t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_f0,local_150._M_dataplus._M_p,local_150._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (",4);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return false;",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      pptVar12 = local_60;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      pptVar12 = pptVar12 + 1;
    } while (pptVar12 !=
             (local_a8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar7 = local_f0;
  std::__ostream_insert<char,std::char_traits<char>>
            (local_f0,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar10 = t_generator::indent((t_generator *)this,poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"return true;",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_down(&this->super_t_oop_generator,poVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_110._M_dataplus._M_p,local_110._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"public int hashCode() {",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  poVar7 = local_f0;
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar10 = t_generator::indent((t_generator *)this,local_f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"return 0;",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar7 = t_generator::indent((t_generator *)this,poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_javame_generator::generate_java_struct_equality(ostream& out, t_struct* tstruct) {
  out << indent() << "public boolean equals(Object that) {" << endl;
  indent_up();
  out << indent() << "if (that == null)" << endl << indent() << "  return false;" << endl
      << indent() << "if (that instanceof " << tstruct->get_name() << ")" << endl << indent()
      << "  return this.equals((" << tstruct->get_name() << ")that);" << endl << indent()
      << "return false;" << endl;
  scope_down(out);
  out << endl;

  out << indent() << "public boolean equals(" << tstruct->get_name() << " that) {" << endl;
  indent_up();
  out << indent() << "if (that == null)" << endl << indent() << "  return false;" << endl
      << indent() << "if (this == that)" << endl << indent() << "  return true;"  << endl;

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    out << endl;

    t_type* t = get_true_type((*m_iter)->get_type());
    // Most existing Thrift code does not use isset or optional/required,
    // so we treat "default" fields as required.
    bool is_optional = (*m_iter)->get_req() == t_field::T_OPTIONAL;
    bool can_be_null = type_can_be_null(t);
    string name = (*m_iter)->get_name();

    string this_present = "true";
    string that_present = "true";
    string unequal;

    if (is_optional || can_be_null) {
      this_present += " && this." + generate_isset_check(*m_iter);
      that_present += " && that." + generate_isset_check(*m_iter);
    }

    out << indent() << "boolean this_present_" << name << " = " << this_present << ";" << endl
        << indent() << "boolean that_present_" << name << " = " << that_present << ";" << endl
        << indent() << "if ("
        << "this_present_" << name << " || that_present_" << name << ") {" << endl;
    indent_up();
    out << indent() << "if (!("
        << "this_present_" << name << " && that_present_" << name << "))" << endl << indent()
        << "  return false;" << endl;

    if (t->is_binary()) {
      unequal = "TBaseHelper.compareTo(this." + name + ", that." + name + ") != 0";
    } else if (can_be_null) {
      unequal = "!this." + name + ".equals(that." + name + ")";
    } else {
      unequal = "this." + name + " != that." + name;
    }

    out << indent() << "if (" << unequal << ")" << endl << indent() << "  return false;" << endl;

    scope_down(out);
  }
  out << endl;
  indent(out) << "return true;" << endl;
  scope_down(out);
  out << endl;

  out << indent() << "public int hashCode() {" << endl;
  indent_up();
  indent(out) << "return 0;" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
}